

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O0

hFILE * hfile_init(size_t struct_size,char *mode,size_t capacity)

{
  hFILE *fp_00;
  char *pcVar1;
  hFILE *fp;
  size_t capacity_local;
  char *mode_local;
  size_t struct_size_local;
  
  fp_00 = (hFILE *)malloc(struct_size);
  if (fp_00 != (hFILE *)0x0) {
    fp = (hFILE *)capacity;
    if (capacity == 0) {
      fp = (hFILE *)0x8000;
    }
    pcVar1 = strchr(mode,0x72);
    if ((pcVar1 != (char *)0x0) && ((hFILE *)0x8000 < fp)) {
      fp = (hFILE *)0x8000;
    }
    pcVar1 = (char *)malloc((size_t)fp);
    fp_00->buffer = pcVar1;
    if (fp_00->buffer != (char *)0x0) {
      fp_00->end = fp_00->buffer;
      fp_00->begin = fp_00->buffer;
      fp_00->limit = (char *)((long)&fp->buffer + (long)fp_00->buffer);
      fp_00->offset = 0;
      fp_00->field_0x30 = fp_00->field_0x30 & 0xfe;
      fp_00->has_errno = 0;
      return fp_00;
    }
  }
  hfile_destroy(fp_00);
  return (hFILE *)0x0;
}

Assistant:

hFILE *hfile_init(size_t struct_size, const char *mode, size_t capacity)
{
    hFILE *fp = (hFILE *) malloc(struct_size);
    if (fp == NULL) goto error;

    if (capacity == 0) capacity = 32768;
    // FIXME For now, clamp input buffer sizes so mpileup doesn't eat memory
    if (strchr(mode, 'r') && capacity > 32768) capacity = 32768;

    fp->buffer = (char *) malloc(capacity);
    if (fp->buffer == NULL) goto error;

    fp->begin = fp->end = fp->buffer;
    fp->limit = &fp->buffer[capacity];

    fp->offset = 0;
    fp->at_eof = 0;
    fp->has_errno = 0;
    return fp;

error:
    hfile_destroy(fp);
    return NULL;
}